

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O2

void __thiscall
features::NearestNeighbor<float>::find(NearestNeighbor<float> *this,float *query,Result *result)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  int iVar5;
  int j;
  ulong uVar6;
  int *piVar7;
  Result *pRVar8;
  float inner_product;
  float fVar9;
  
  pfVar1 = &result->dist_2nd_best;
  result->dist_1st_best = 0.0;
  result->dist_2nd_best = 0.0;
  result->index_1st_best = 0;
  result->index_2nd_best = 0;
  pfVar3 = this->elements;
  uVar6 = 0;
  uVar4 = (ulong)(uint)this->dimensions;
  if (this->dimensions < 1) {
    uVar4 = uVar6;
  }
  iVar2 = this->num_elements;
  if (this->num_elements < 1) {
    iVar2 = 0;
  }
  while (iVar5 = (int)uVar6, iVar5 != iVar2) {
    fVar9 = 0.0;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      fVar9 = fVar9 + query[uVar6] * pfVar3[uVar6];
    }
    if (*pfVar1 <= fVar9) {
      piVar7 = &result->index_2nd_best;
      pRVar8 = (Result *)pfVar1;
      if (result->dist_1st_best <= fVar9) {
        result->index_2nd_best = result->index_1st_best;
        *pfVar1 = result->dist_1st_best;
        piVar7 = &result->index_1st_best;
        pRVar8 = result;
      }
      *piVar7 = iVar5;
      pRVar8->dist_1st_best = fVar9;
    }
    pfVar3 = pfVar3 + uVar4;
    uVar6 = (ulong)(iVar5 + 1);
  }
  fVar9 = 2.0 - (result->dist_1st_best + result->dist_1st_best);
  if (fVar9 <= 0.0) {
    fVar9 = 0.0;
  }
  result->dist_1st_best = fVar9;
  fVar9 = 2.0 - (result->dist_2nd_best + result->dist_2nd_best);
  if (fVar9 <= 0.0) {
    fVar9 = 0.0;
  }
  result->dist_2nd_best = fVar9;
  return;
}

Assistant:

void
NearestNeighbor<float>::find (float const* query,
    NearestNeighbor<float>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0.0f;
    result->dist_2nd_best = 0.0f;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    float_inner_prod(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual (square) distances.
     */
    result->dist_1st_best = std::max(0.0f, 2.0f - 2.0f * result->dist_1st_best);
    result->dist_2nd_best = std::max(0.0f, 2.0f - 2.0f * result->dist_2nd_best);
}